

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::exception<char_const(&)[49],CylHead&>
          (exception *this,char (*args) [49],CylHead *args_1)

{
  CylHead *in_RCX;
  string local_40;
  CylHead *local_20;
  CylHead *args_local_1;
  char (*args_local) [49];
  exception *this_local;
  
  local_20 = args_1;
  args_local_1 = (CylHead *)args;
  args_local = (char (*) [49])this;
  make_string<char_const(&)[49],CylHead&>(&local_40,(util *)args,(char (*) [49])args_1,in_RCX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}